

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int s390_store_adtl_status(S390CPU *cpu,hwaddr addr,hwaddr len)

{
  _Bool _Var1;
  uint64_t uVar2;
  int local_3c;
  SigpAdtlSaveArea *pSStack_38;
  int i;
  hwaddr save;
  SigpAdtlSaveArea *sa;
  hwaddr len_local;
  hwaddr addr_local;
  S390CPU *cpu_local;
  
  pSStack_38 = (SigpAdtlSaveArea *)len;
  sa = (SigpAdtlSaveArea *)len;
  len_local = addr;
  addr_local = (hwaddr)cpu;
  save = (hwaddr)cpu_physical_memory_map_s390x
                           ((cpu->parent_obj).as,addr,(hwaddr *)&stack0xffffffffffffffc8,true);
  if ((void *)save == (void *)0x0) {
    cpu_local._4_4_ = -0xe;
  }
  else if (pSStack_38 == sa) {
    _Var1 = s390_has_feat(*(uc_struct_conflict14 **)(addr_local + 0x91c8),S390_FEAT_VECTOR);
    if (_Var1) {
      for (local_3c = 0; local_3c < 0x20; local_3c = local_3c + 1) {
        uVar2 = cpu_to_be64(*(uint64_t *)(addr_local + 0x8d90 + (long)local_3c * 0x10));
        *(uint64_t *)(save + (long)local_3c * 0x10) = uVar2;
        uVar2 = cpu_to_be64(*(uint64_t *)(addr_local + (long)local_3c * 0x10 + 0x8d98));
        *(uint64_t *)(save + (long)local_3c * 0x10 + 8) = uVar2;
      }
    }
    _Var1 = s390_has_feat(*(uc_struct_conflict14 **)(addr_local + 0x91c8),S390_FEAT_GUARDED_STORAGE)
    ;
    if ((_Var1) && ((SigpAdtlSaveArea *)0x7ff < sa)) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        uVar2 = cpu_to_be64(*(uint64_t *)(addr_local + 0x8fd0 + (long)local_3c * 8));
        *(uint64_t *)(save + 0x400 + (long)local_3c * 8) = uVar2;
      }
    }
    cpu_physical_memory_unmap_s390x
              (*(AddressSpace **)(addr_local + 0x118),(void *)save,(hwaddr)sa,true,(hwaddr)sa);
    cpu_local._4_4_ = 0;
  }
  else {
    cpu_physical_memory_unmap_s390x
              (*(AddressSpace **)(addr_local + 0x118),(void *)save,(hwaddr)sa,true,0);
    cpu_local._4_4_ = -0xe;
  }
  return cpu_local._4_4_;
}

Assistant:

int s390_store_adtl_status(S390CPU *cpu, hwaddr addr, hwaddr len)
{
    SigpAdtlSaveArea *sa;
    hwaddr save = len;
    int i;

    sa = cpu_physical_memory_map(CPU(cpu)->as, addr, &save, true);
    if (!sa) {
        return -EFAULT;
    }
    if (save != len) {
        cpu_physical_memory_unmap(CPU(cpu)->as, sa, len, 1, 0);
        return -EFAULT;
    }

    if (s390_has_feat(cpu->env.uc, S390_FEAT_VECTOR)) {
        for (i = 0; i < 32; i++) {
            sa->vregs[i][0] = cpu_to_be64(cpu->env.vregs[i][0]);
            sa->vregs[i][1] = cpu_to_be64(cpu->env.vregs[i][1]);
        }
    }
    if (s390_has_feat(cpu->env.uc, S390_FEAT_GUARDED_STORAGE) && len >= ADTL_GS_MIN_SIZE) {
        for (i = 0; i < 4; i++) {
            sa->gscb[i] = cpu_to_be64(cpu->env.gscb[i]);
        }
    }

    cpu_physical_memory_unmap(CPU(cpu)->as, sa, len, 1, len);
    return 0;
}